

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O1

Aig_Man_t * Saig_ManCreateEquivMiter(Aig_Man_t *pAig,Vec_Int_t *vPairs,int fAddOuts)

{
  char *__s;
  void *pvVar1;
  int iVar2;
  uint uVar3;
  Aig_Man_t *p;
  size_t sVar4;
  char *__dest;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  ulong uVar8;
  Aig_Obj_t *p1;
  long lVar9;
  void *pvVar10;
  int iVar11;
  
  if (pAig->nConstrs < 1) {
    p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
    __s = pAig->pName;
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar4 = strlen(__s);
      __dest = (char *)malloc(sVar4 + 1);
      strcpy(__dest,__s);
    }
    p->pName = __dest;
    p->nConstrs = pAig->nConstrs;
    pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
    pVVar6 = pAig->vCis;
    if (0 < pVVar6->nSize) {
      lVar9 = 0;
      do {
        pvVar10 = pVVar6->pArray[lVar9];
        pAVar5 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar10 + 0x28) = pAVar5;
        lVar9 = lVar9 + 1;
        pVVar6 = pAig->vCis;
      } while (lVar9 < pVVar6->nSize);
    }
    pVVar6 = pAig->vObjs;
    if (0 < pVVar6->nSize) {
      lVar9 = 0;
      do {
        pvVar10 = pVVar6->pArray[lVar9];
        if ((pvVar10 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar10 + 0x18) & 7) - 7)) {
          if (((ulong)pvVar10 & 1) != 0) goto LAB_006d742e;
          uVar7 = *(ulong *)((long)pvVar10 + 8) & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar10 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
          }
          uVar7 = *(ulong *)((long)pvVar10 + 0x10) & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar10 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
          }
          pAVar5 = Aig_And(p,pAVar5,p1);
          *(Aig_Obj_t **)((long)pvVar10 + 0x28) = pAVar5;
        }
        lVar9 = lVar9 + 1;
        pVVar6 = pAig->vObjs;
      } while (lVar9 < pVVar6->nSize);
    }
    if ((vPairs->nSize & 1) != 0) {
      __assert_fail("Vec_IntSize(vPairs) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                    ,0x72,"Aig_Man_t *Saig_ManCreateEquivMiter(Aig_Man_t *, Vec_Int_t *, int)");
    }
    iVar11 = vPairs->nSize;
    if (0 < iVar11) {
      lVar9 = 1;
      do {
        pVVar6 = pAig->vObjs;
        if (pVVar6 == (Vec_Ptr_t *)0x0) {
          pvVar10 = (void *)0x0;
        }
        else {
          uVar3 = vPairs->pArray[lVar9 + -1];
          if (((int)uVar3 < 0) || (pVVar6->nSize <= (int)uVar3)) goto LAB_006d73f0;
          pvVar10 = pVVar6->pArray[uVar3];
        }
        if (iVar11 <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar11 = vPairs->pArray[lVar9];
        if (((long)iVar11 < 0) || (pVVar6->nSize <= iVar11)) goto LAB_006d73f0;
        pvVar1 = pVVar6->pArray[iVar11];
        pAVar5 = Aig_Exor(p,*(Aig_Obj_t **)((long)pvVar10 + 0x28),
                          *(Aig_Obj_t **)((long)pvVar1 + 0x28));
        Aig_ObjCreateCo(p,(Aig_Obj_t *)
                          ((ulong)((*(uint *)((long)pvVar1 + 0x18) ^ *(uint *)((long)pvVar10 + 0x18)
                                   ) >> 3 & 1) ^ (ulong)pAVar5));
        iVar11 = vPairs->nSize;
        iVar2 = (int)lVar9;
        lVar9 = lVar9 + 2;
      } while (iVar2 + 1 < iVar11);
    }
    if (fAddOuts == 0) {
      Aig_ManCleanup(p);
    }
    else {
      if (0 < pAig->nRegs) {
        iVar11 = 0;
        do {
          uVar3 = pAig->nTruePos + iVar11;
          if (((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) {
LAB_006d73f0:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar10 = pAig->vCos->pArray[uVar3];
          if (((ulong)pvVar10 & 1) != 0) {
LAB_006d742e:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar7 = *(ulong *)((long)pvVar10 + 8);
          uVar8 = uVar7 & 0xfffffffffffffffe;
          if (uVar8 == 0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = (Aig_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar8 + 0x28));
          }
          Aig_ObjCreateCo(p,pAVar5);
          iVar11 = iVar11 + 1;
        } while (iVar11 < pAig->nRegs);
      }
      Aig_ManCleanup(p);
      if (fAddOuts != 0) {
        Aig_ManSetRegNum(p,pAig->nRegs);
      }
    }
  }
  else {
    puts("The AIG manager should have no constraints.");
    p = (Aig_Man_t *)0x0;
  }
  return p;
}

Assistant:

Aig_Man_t * Saig_ManCreateEquivMiter( Aig_Man_t * pAig, Vec_Int_t * vPairs, int fAddOuts )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pObj2, * pMiter;
    int i;
    if ( pAig->nConstrs > 0 )
    {
        printf( "The AIG manager should have no constraints.\n" );
        return NULL;
    }
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create POs
    assert( Vec_IntSize(vPairs) % 2 == 0 );
    Aig_ManForEachObjVec( vPairs, pAig, pObj, i )
    {
        pObj2  = Aig_ManObj( pAig, Vec_IntEntry(vPairs, ++i) );
        pMiter = Aig_Exor( pAigNew, (Aig_Obj_t *)pObj->pData, (Aig_Obj_t *)pObj2->pData );
        pMiter = Aig_NotCond( pMiter, pObj->fPhase ^ pObj2->fPhase );
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    if ( fAddOuts )
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pAigNew );
    if ( fAddOuts )
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}